

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O2

void frame_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  Fl_Color FVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  undefined4 in_register_0000003c;
  Fl_Color bc_00;
  uint uVar9;
  int iVar10;
  uint local_74;
  ulong local_68;
  
  local_68 = CONCAT44(in_register_0000003c,x);
  bc_00 = (Fl_Color)c;
  uVar4 = (ulong)(uint)h;
  puVar3 = fl_gray_ramp();
  iVar1 = w - h;
  if (iVar1 == 0) {
    pcVar7 = "KLDIIJLM";
    for (uVar4 = 2; pcVar7 = pcVar7 + 4, 1 < uVar4; uVar4 = uVar4 - 1) {
      FVar2 = shade_color(puVar3[*pcVar7],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4046800000000000,0x4060e00000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
      FVar2 = shade_color(puVar3[pcVar7[1]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4073b00000000000,0x4079500000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
      FVar2 = shade_color(puVar3[pcVar7[2]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x406c200000000000,0x4073b00000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
      FVar2 = shade_color(puVar3[pcVar7[3]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4060e00000000000,0x406c200000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
      local_68 = (ulong)((int)local_68 + 1);
      y = y + 1;
      w = w - 2;
    }
  }
  else if (iVar1 == 0 || w < h) {
    if (w < h) {
      uVar6 = (h + y) - w / 2;
      iVar1 = w / 2 + y;
      iVar10 = h - w;
      local_74 = x + w;
      pcVar7 = "KLDIIJLM";
      for (uVar4 = 2; pcVar7 = pcVar7 + 4, local_74 = local_74 - 1, 1 < uVar4; uVar4 = uVar4 - 1) {
        FVar2 = shade_color(puVar3[*pcVar7],bc_00);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0x4046800000000000,0x4060e00000000000,fl_graphics_driver,local_68 & 0xffffffff,
                   (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
        FVar2 = shade_color(puVar3[pcVar7[1]],bc_00);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0,0x4046800000000000,fl_graphics_driver,local_68 & 0xffffffff,(ulong)(uint)y,
                   (ulong)(uint)w,(ulong)(uint)w);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)local_74,iVar1,(ulong)uVar6);
        uVar9 = iVar10 + y;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0x4073b00000000000,0x4076800000000000,fl_graphics_driver,local_68 & 0xffffffff,
                   (ulong)uVar9,(ulong)(uint)w,(ulong)(uint)w);
        FVar2 = shade_color(puVar3[pcVar7[2]],bc_00);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0x406c200000000000,0x4073b00000000000,fl_graphics_driver,local_68 & 0xffffffff,
                   (ulong)uVar9,(ulong)(uint)w,(ulong)(uint)w);
        FVar2 = shade_color(puVar3[pcVar7[3]],bc_00);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0x4066800000000000,0x406c200000000000,fl_graphics_driver,local_68 & 0xffffffff,
                   (ulong)uVar9,(ulong)(uint)w,(ulong)(uint)w);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,local_68 & 0xffffffff,iVar1,(ulong)uVar6);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                  (0x4060e00000000000,0x4066800000000000,fl_graphics_driver,local_68 & 0xffffffff,
                   (ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)w);
        local_68 = (ulong)((int)local_68 + 1);
        y = y + 1;
        w = w - 2;
      }
    }
  }
  else {
    uVar8 = (ulong)(uint)((w + x) - h / 2);
    uVar6 = h / 2 + x;
    local_74 = y + h;
    pcVar7 = "KLDIIJLM";
    for (uVar5 = 2; pcVar7 = pcVar7 + 4, local_74 = local_74 - 1, 1 < uVar5; uVar5 = uVar5 - 1) {
      FVar2 = shade_color(puVar3[*pcVar7],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4056800000000000,0x4060e00000000000,fl_graphics_driver,local_68,(ulong)(uint)y,
                 uVar4,uVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)uVar6,(ulong)(uint)y,uVar8);
      uVar9 = iVar1 + (int)local_68;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4046800000000000,0x4056800000000000,fl_graphics_driver,(ulong)uVar9,
                 (ulong)(uint)y,uVar4,uVar4);
      FVar2 = shade_color(puVar3[pcVar7[1]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4073b00000000000,0x4079500000000000,fl_graphics_driver,(ulong)uVar9,
                 (ulong)(uint)y,uVar4,uVar4);
      FVar2 = shade_color(puVar3[pcVar7[2]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4070e00000000000,0x4073b00000000000,fl_graphics_driver,(ulong)uVar9,
                 (ulong)(uint)y,uVar4,uVar4);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)uVar6,(ulong)local_74,uVar8);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x406c200000000000,0x4070e00000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,uVar4,uVar4);
      FVar2 = shade_color(puVar3[pcVar7[3]],bc_00);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)FVar2);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x20])
                (0x4060e00000000000,0x406c200000000000,fl_graphics_driver,local_68 & 0xffffffff,
                 (ulong)(uint)y,uVar4,uVar4);
      local_68 = (ulong)((int)local_68 + 1);
      y = y + 1;
      uVar4 = (ulong)((int)uVar4 - 2);
    }
  }
  return;
}

Assistant:

static void frame_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  size_t b = strlen(c) / 4 + 1;

  if (w==h) {
    for (; b > 1; b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, h, 135.0, 225.0);
    }
  } else if (w>h) {
    int d = h/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 90.0, 135.0);
      fl_xyline(x+d, y, x+w-d);
      fl_arc(x+w-h, y, h, h, 45.0, 90.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 315.0, 405.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x+w-h, y, h, h, 270.0, 315.0);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_arc(x, y, h, h, 225.0, 270.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, h, h, 135.0, 225.0);
    }
  } else if (w<h) {
    int d = w/2;
    for (; b > 1; d--, b --, x ++, y ++, w -= 2, h -= 2)
    {
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 45.0, 135.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y, w, w, 0.0, 45.0);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_arc(x, y+h-w, w, w, 315.0, 360.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 225.0, 315.0);
      fl_color(shade_color(g[(int)*c++], bc));
      fl_arc(x, y+h-w, w, w, 180.0, 225.0);
      fl_yxline(x, y+d, y+h-d);
      fl_arc(x, y, w, w, 135.0, 180.0);
    }
  }
}